

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O0

void __thiscall
cmDebugServer::cmDebugServer(cmDebugServer *this,cmDebugger *debugger,cmConnection *conn)

{
  cmConnection *conn_local;
  cmDebugger *debugger_local;
  cmDebugServer *this_local;
  
  cmServerBase::cmServerBase(&this->super_cmServerBase,conn);
  cmDebuggerListener::cmDebuggerListener(&this->super_cmDebuggerListener,debugger);
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmDebugServer_00cc3fc0;
  (this->super_cmDebuggerListener)._vptr_cmDebuggerListener = (_func_int **)&DAT_00cc4028;
  auto_async_t::auto_async_t(&this->BroadcastQueueSignal);
  std::mutex::mutex(&this->BroadcastQueueMutex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->BroadcastQueue);
  return;
}

Assistant:

cmDebugServer::cmDebugServer(cmDebugger& debugger, cmConnection* conn)
  : cmServerBase(conn)
  , cmDebuggerListener(debugger)
{
}